

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O1

int __thiscall
pybind11::detail::process_attribute<pybind11::arg,_void>::init
          (process_attribute<pybind11::arg,_void> *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  bool local_22;
  bool local_21;
  handle local_20;
  void *local_18;
  
  if ((((byte)ctx[0x59] & 0x40) != 0) && (*(long *)(ctx + 0x18) == *(long *)(ctx + 0x20))) {
    local_18 = (void *)0x0;
    local_20.m_ptr = (PyObject *)0x0;
    local_21 = true;
    local_22 = false;
    std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
    ::emplace_back<char_const(&)[5],decltype(nullptr),pybind11::handle,bool,bool>
              ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
                *)(ctx + 0x18),(char (*) [5])"self",&local_18,&local_20,&local_21,&local_22);
  }
  local_18 = (void *)0x0;
  local_20.m_ptr = (PyObject *)0x0;
  local_21 = (bool)(~(byte)this[8] & 1);
  local_22 = (bool)((byte)this[8] >> 1 & 1);
  std::vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>::
  emplace_back<char_const*const&,decltype(nullptr),pybind11::handle,bool,bool_const&>
            ((vector<pybind11::detail::argument_record,std::allocator<pybind11::detail::argument_record>>
              *)(ctx + 0x18),(char **)this,&local_18,&local_20,&local_21,&local_22);
  return extraout_EAX;
}

Assistant:

static void init(const arg &a, function_record *r) {
        if (r->is_method && r->args.empty())
            r->args.emplace_back("self", nullptr, handle(), true /*convert*/, false /*none not allowed*/);
        r->args.emplace_back(a.name, nullptr, handle(), !a.flag_noconvert, a.flag_none);
    }